

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall
wallet::RunWithinTxn
          (wallet *this,WalletBatch *batch,string_view process_desc,
          function<bool_(wallet::WalletBatch_&)> *func)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  Logger *pLVar4;
  int source_line;
  char *pcVar5;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  string_view process_desc_local;
  
  pcVar5 = process_desc._M_str;
  process_desc_local._M_str = (char *)process_desc._M_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  process_desc_local._M_len = (size_t)batch;
  cVar2 = (**(code **)(**(long **)this + 0x58))();
  if (cVar2 == '\0') {
    pLVar4 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,WALLETDB,Debug);
    if (bVar3) {
      pcVar5 = "Error: cannot create db txn for %s\n";
      source_line = 0x4e2;
LAB_001ae3b1:
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp"
      ;
      source_file._M_len = 99;
      logging_function._M_str = "RunWithinTxn";
      logging_function._M_len = 0xc;
      LogPrintFormatInternal<std::basic_string_view<char,std::char_traits<char>>>
                (logging_function,source_file,source_line,WALLETDB,Debug,
                 (ConstevalFormatString<1U>)pcVar5,&process_desc_local);
    }
    goto LAB_001ae427;
  }
  if (*(long *)(pcVar5 + 0x10) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_function_call();
    }
    goto LAB_001ae456;
  }
  cVar2 = (**(code **)(pcVar5 + 0x18))(pcVar5,this);
  if (cVar2 == '\0') {
    pLVar4 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,WALLETDB,Debug);
    if (bVar3) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp"
      ;
      source_file_00._M_len = 99;
      logging_function_00._M_str = "RunWithinTxn";
      logging_function_00._M_len = 0xc;
      LogPrintFormatInternal<std::basic_string_view<char,std::char_traits<char>>>
                (logging_function_00,source_file_00,0x4e8,WALLETDB,Debug,
                 (ConstevalFormatString<1U>)0x4a633b,&process_desc_local);
    }
    (**(code **)(**(long **)this + 0x68))();
LAB_001ae427:
    bVar3 = false;
  }
  else {
    cVar2 = (**(code **)(**(long **)this + 0x60))();
    bVar3 = true;
    if (cVar2 == '\0') {
      pLVar4 = LogInstance();
      bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,WALLETDB,Debug);
      if (bVar3) {
        pcVar5 = "Error: cannot commit db txn for %s\n";
        source_line = 0x4ee;
        goto LAB_001ae3b1;
      }
      goto LAB_001ae427;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
LAB_001ae456:
  __stack_chk_fail();
}

Assistant:

static bool RunWithinTxn(WalletBatch& batch, std::string_view process_desc, const std::function<bool(WalletBatch&)>& func)
{
    if (!batch.TxnBegin()) {
        LogDebug(BCLog::WALLETDB, "Error: cannot create db txn for %s\n", process_desc);
        return false;
    }

    // Run procedure
    if (!func(batch)) {
        LogDebug(BCLog::WALLETDB, "Error: %s failed\n", process_desc);
        batch.TxnAbort();
        return false;
    }

    if (!batch.TxnCommit()) {
        LogDebug(BCLog::WALLETDB, "Error: cannot commit db txn for %s\n", process_desc);
        return false;
    }

    // All good
    return true;
}